

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFramebufferDefaultStateQueryTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::FramebufferDefaultStateQueryTests::init
          (FramebufferDefaultStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  TestNode *pTVar2;
  long *plVar3;
  long *extraout_RAX;
  long *plVar4;
  long *local_70 [2];
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"framebuffer_default_width_","");
  plVar3 = (long *)std::__cxx11::string::append((char *)local_70);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_40 = *plVar4;
    lStack_38 = plVar3[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar4;
    local_50 = (long *)*plVar3;
  }
  local_48 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,(char *)local_50,"Test FRAMEBUFFER_DEFAULT_WIDTH")
  ;
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2[1].m_testCtx = (TestContext *)0x11;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215e5f0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"framebuffer_default_height_","");
  plVar3 = (long *)std::__cxx11::string::append((char *)local_70);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_40 = *plVar4;
    lStack_38 = plVar3[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar4;
    local_50 = (long *)*plVar3;
  }
  local_48 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,(char *)local_50,"Test FRAMEBUFFER_DEFAULT_HEIGHT"
            );
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2[1].m_testCtx = (TestContext *)0x100000011;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215e5f0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"framebuffer_default_samples_","");
  plVar3 = (long *)std::__cxx11::string::append((char *)local_70);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_40 = *plVar4;
    lStack_38 = plVar3[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar4;
    local_50 = (long *)*plVar3;
  }
  local_48 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,(char *)local_50,
             "Test FRAMEBUFFER_DEFAULT_SAMPLES");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  *(undefined4 *)&pTVar2[1].m_testCtx = 0x11;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215e668;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"framebuffer_default_fixed_sample_locations_","");
  plVar3 = (long *)std::__cxx11::string::append((char *)local_70);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_40 = *plVar4;
    lStack_38 = plVar3[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar4;
    local_50 = (long *)*plVar3;
  }
  local_48 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,(char *)local_50,
             "Test FRAMEBUFFER_DEFAULT_FIXED_SAMPLE_LOCATIONS");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  *(undefined4 *)&pTVar2[1].m_testCtx = 0x11;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215e6c8;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  plVar3 = local_60;
  if (local_70[0] != plVar3) {
    operator_delete(local_70[0],local_60[0] + 1);
    plVar3 = extraout_RAX;
  }
  return (int)plVar3;
}

Assistant:

void FramebufferDefaultStateQueryTests::init (void)
{
	static const QueryType verifiers[] =
	{
		QUERY_FRAMEBUFFER_INTEGER,
	};

#define FOR_EACH_VERIFIER(X) \
	for (int verifierNdx = 0; verifierNdx < DE_LENGTH_OF_ARRAY(verifiers); ++verifierNdx)	\
	{																						\
		const char* verifierSuffix = getVerifierSuffix(verifiers[verifierNdx]);				\
		const QueryType verifier = verifiers[verifierNdx];								\
		this->addChild(X);																	\
	}

	FOR_EACH_VERIFIER(new FramebufferDimensionTest				(m_context, verifier, FramebufferDimensionTest::DIMENSION_WIDTH,	(std::string("framebuffer_default_width_") + verifierSuffix).c_str(),					"Test FRAMEBUFFER_DEFAULT_WIDTH"));
	FOR_EACH_VERIFIER(new FramebufferDimensionTest				(m_context, verifier, FramebufferDimensionTest::DIMENSION_HEIGHT,	(std::string("framebuffer_default_height_") + verifierSuffix).c_str(),					"Test FRAMEBUFFER_DEFAULT_HEIGHT"));
	FOR_EACH_VERIFIER(new FramebufferSamplesTest				(m_context, verifier,												(std::string("framebuffer_default_samples_") + verifierSuffix).c_str(),					"Test FRAMEBUFFER_DEFAULT_SAMPLES"));
	FOR_EACH_VERIFIER(new FramebufferFixedSampleLocationsTest	(m_context, verifier,												(std::string("framebuffer_default_fixed_sample_locations_") + verifierSuffix).c_str(),	"Test FRAMEBUFFER_DEFAULT_FIXED_SAMPLE_LOCATIONS"));

#undef FOR_EACH_VERIFIER
}